

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_signature.c
# Opt level: O0

void signature_destroy(signature s)

{
  signature_node psVar1;
  signature in_RDI;
  signature_node node;
  size_t index;
  ulong index_00;
  
  if (in_RDI != (signature)0x0) {
    for (index_00 = 0; index_00 < in_RDI->count; index_00 = index_00 + 1) {
      psVar1 = signature_at(in_RDI,index_00);
      if ((psVar1 != (signature_node)0x0) && (psVar1->name != (char *)0x0)) {
        free(psVar1->name);
      }
    }
    set_destroy(in_RDI->map);
    free(in_RDI);
  }
  return;
}

Assistant:

void signature_destroy(signature s)
{
	if (s != NULL)
	{
		size_t index;

		for (index = 0; index < s->count; ++index)
		{
			signature_node node = signature_at(s, index);

			if (node != NULL && node->name != NULL)
			{
				free(node->name);
			}
		}

		set_destroy(s->map);

		free(s);
	}
}